

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O1

bool __thiscall cmGetPropertyCommand::HandleInstallMode(cmGetPropertyCommand *this)

{
  bool bVar1;
  cmake *this_00;
  cmInstalledFile *this_01;
  char *value_00;
  string value;
  string local_1a8;
  undefined1 local_188 [112];
  ios_base local_118 [264];
  
  if ((this->Name)._M_string_length == 0) {
    local_188._0_8_ = local_188 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_188,"not given name for INSTALL scope.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_188);
    if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
      operator_delete((void *)local_188._0_8_,CONCAT71(local_188._17_7_,local_188[0x10]) + 1);
    }
  }
  else {
    this_00 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    this_01 = cmake::GetOrCreateInstalledFile(this_00,(this->super_cmCommand).Makefile,&this->Name);
    if (this_01 != (cmInstalledFile *)0x0) {
      local_188._8_8_ = 0;
      local_188[0x10] = '\0';
      local_188._0_8_ = local_188 + 0x10;
      bVar1 = cmInstalledFile::GetProperty(this_01,&this->PropertyName,(string *)local_188);
      value_00 = (char *)local_188._0_8_;
      if (!bVar1) {
        value_00 = (char *)0x0;
      }
      StoreResult(this,value_00);
      if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
        operator_delete((void *)local_188._0_8_,CONCAT71(local_188._17_7_,local_188[0x10]) + 1);
      }
      return true;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"given INSTALL name that could not be found or created: ",0x37);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,(this->Name)._M_dataplus._M_p,(this->Name)._M_string_length);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
    std::ios_base::~ios_base(local_118);
  }
  return false;
}

Assistant:

bool cmGetPropertyCommand::HandleInstallMode()
{
  if(this->Name.empty())
    {
    this->SetError("not given name for INSTALL scope.");
    return false;
    }

  // Get the installed file.
  cmake* cm = this->Makefile->GetCMakeInstance();

  if(cmInstalledFile* file = cm->GetOrCreateInstalledFile(
    this->Makefile, this->Name))
    {
    std::string value;
    bool isSet = file->GetProperty(this->PropertyName, value);

    return this->StoreResult(isSet ? value.c_str() : 0);
    }
  else
    {
    std::ostringstream e;
    e << "given INSTALL name that could not be found or created: "
      << this->Name;
    this->SetError(e.str());
    return false;
    }
}